

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Vacuum(Parse *pParse,Token *pNm,Expr *pInto)

{
  int iVar1;
  Vdbe *p;
  uint local_30;
  int local_2c;
  int iIntoReg;
  int iDb;
  Vdbe *v;
  Expr *pInto_local;
  Token *pNm_local;
  Parse *pParse_local;
  
  pInto_local = (Expr *)pNm;
  pNm_local = (Token *)pParse;
  p = sqlite3GetVdbe(pParse);
  local_2c = 0;
  if ((((p != (Vdbe *)0x0) && (*(int *)&pNm_local[3].z == 0)) &&
      ((pInto_local == (Expr *)0x0 ||
       (local_2c = sqlite3TwoPartName((Parse *)pNm_local,(Token *)pInto_local,(Token *)pInto_local,
                                      (Token **)&pInto_local), -1 < local_2c)))) && (local_2c != 1))
  {
    local_30 = 0;
    if ((pInto != (Expr *)0x0) &&
       (iVar1 = sqlite3ResolveSelfReference((Parse *)pNm_local,(Table *)0x0,0,pInto,(ExprList *)0x0)
       , iVar1 == 0)) {
      local_30 = pNm_local[3].n + 1;
      pNm_local[3].n = local_30;
      sqlite3ExprCode((Parse *)pNm_local,pInto,local_30);
    }
    sqlite3VdbeAddOp2(p,5,local_2c,local_30);
    sqlite3VdbeUsesBtree(p,local_2c);
  }
  sqlite3ExprDelete((sqlite3 *)pNm_local->z,pInto);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Vacuum(Parse *pParse, Token *pNm, Expr *pInto){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int iDb = 0;
  if( v==0 ) goto build_vacuum_end;
  if( pParse->nErr ) goto build_vacuum_end;
  if( pNm ){
#ifndef SQLITE_BUG_COMPATIBLE_20160819
    /* Default behavior:  Report an error if the argument to VACUUM is
    ** not recognized */
    iDb = sqlite3TwoPartName(pParse, pNm, pNm, &pNm);
    if( iDb<0 ) goto build_vacuum_end;
#else
    /* When SQLITE_BUG_COMPATIBLE_20160819 is defined, unrecognized arguments
    ** to VACUUM are silently ignored.  This is a back-out of a bug fix that
    ** occurred on 2016-08-19 (https://www.sqlite.org/src/info/083f9e6270).
    ** The buggy behavior is required for binary compatibility with some
    ** legacy applications. */
    iDb = sqlite3FindDb(pParse->db, pNm);
    if( iDb<0 ) iDb = 0;
#endif
  }
  if( iDb!=1 ){
    int iIntoReg = 0;
    if( pInto && sqlite3ResolveSelfReference(pParse,0,0,pInto,0)==0 ){
      iIntoReg = ++pParse->nMem;
      sqlite3ExprCode(pParse, pInto, iIntoReg);
    }
    sqlite3VdbeAddOp2(v, OP_Vacuum, iDb, iIntoReg);
    sqlite3VdbeUsesBtree(v, iDb);
  }
build_vacuum_end:
  sqlite3ExprDelete(pParse->db, pInto);
  return;
}